

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O0

RTVector3 __thiscall RTIMUMagCal::removeMagCalData(RTIMUMagCal *this)

{
  int iVar1;
  RTVector3 RVar2;
  RTIMUMagCal *this_local;
  undefined4 uStack_10;
  RTVector3 ret;
  
  RTVector3::RTVector3((RTVector3 *)((long)&this_local + 4));
  if (this->m_magCalCount != 0) {
    iVar1 = this->m_magCalOutIndex;
    this->m_magCalOutIndex = iVar1 + 1;
    RTVector3::operator=((RTVector3 *)((long)&this_local + 4),&this->m_magMax + (long)iVar1 + 2);
    if (this->m_magCalOutIndex == 20000) {
      this->m_magCalOutIndex = 0;
    }
    this->m_magCalCount = this->m_magCalCount + -1;
    iVar1 = findOctant(this,(RTVector3 *)((long)&this_local + 4));
    this->m_octantCounts[iVar1] = this->m_octantCounts[iVar1] + -1;
  }
  RVar2.m_data[0] = (RTFLOAT)this_local._4_4_;
  RVar2.m_data[1] = (RTFLOAT)uStack_10;
  RVar2.m_data[2] = ret.m_data[0];
  return (RTVector3)RVar2.m_data;
}

Assistant:

RTVector3 RTIMUMagCal::removeMagCalData()
{
    RTVector3 ret;

    if (m_magCalCount == 0)
        return ret;

    ret = m_magCalSamples[m_magCalOutIndex++];
    if (m_magCalOutIndex == RTIMUCALDEFS_MAX_MAG_SAMPLES)
        m_magCalOutIndex = 0;
    m_magCalCount--;
    m_octantCounts[findOctant(ret)]--;
    return ret;
}